

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::initTestMessage(Builder builder)

{
  Reader value;
  Reader value_00;
  initializer_list<int> value_01;
  initializer_list<int> value_02;
  initializer_list<int> value_03;
  initializer_list<capnp::Text::Reader> value_04;
  initializer_list<capnp::Text::Reader> value_05;
  initializer_list<capnp::Text::Reader> value_06;
  Builder l;
  Builder e;
  Builder lists;
  ListBuilder local_f0;
  undefined1 local_c8 [24];
  undefined8 uStack_b0;
  StructDataBitCount local_a8;
  StructPointerCount SStack_a4;
  ElementSize EStack_a2;
  undefined1 uStack_a1;
  undefined1 local_98 [40];
  PointerBuilder local_70;
  StructBuilder local_58;
  
  PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_f0,(StructSize)0xa0000);
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  local_c8._16_8_ = local_58.pointers;
  PointerBuilder::initStructList(&local_f0,(PointerBuilder *)local_c8,2,(StructSize)0x0);
  local_c8._16_8_ = local_58.pointers + 1;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initStructList(&local_f0,(PointerBuilder *)local_c8,4,(StructSize)0x1);
  local_c8._16_8_ = local_58.pointers + 2;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initStructList(&local_f0,(PointerBuilder *)local_c8,2,(StructSize)0x1);
  local_c8._16_8_ = local_58.pointers + 3;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initStructList(&local_f0,(PointerBuilder *)local_c8,2,(StructSize)0x1);
  local_c8._16_8_ = local_58.pointers + 4;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initStructList(&local_f0,(PointerBuilder *)local_c8,2,(StructSize)0x1);
  local_c8._16_8_ = local_58.pointers + 5;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initStructList(&local_f0,(PointerBuilder *)local_c8,2,(StructSize)0x1);
  local_c8._16_8_ = local_58.pointers + 6;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initStructList(&local_f0,(PointerBuilder *)local_c8,2,(StructSize)0x10000);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  local_f0.ptr = (byte *)local_58.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x0,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,0);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  local_f0.ptr = (byte *)local_58.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x0,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,1);
  local_f0.ptr = (byte *)(local_58.pointers + 1);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,0);
  *(byte *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value =
       (byte)((WireValue<uint32_t>_conflict *)local_f0.ptr)->value | 1;
  local_f0.ptr = (byte *)(local_58.pointers + 1);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,1);
  *(byte *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value =
       (byte)((WireValue<uint32_t>_conflict *)local_f0.ptr)->value & 0xfe;
  local_f0.ptr = (byte *)(local_58.pointers + 1);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,2);
  *(byte *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value =
       (byte)((WireValue<uint32_t>_conflict *)local_f0.ptr)->value | 1;
  local_f0.ptr = (byte *)(local_58.pointers + 1);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,3);
  *(byte *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value =
       (byte)((WireValue<uint32_t>_conflict *)local_f0.ptr)->value | 1;
  local_f0.ptr = (byte *)(local_58.pointers + 2);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,0);
  *(byte *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value = '{';
  local_f0.ptr = (byte *)(local_58.pointers + 2);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,1);
  *(byte *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value = '-';
  local_f0.ptr = (byte *)(local_58.pointers + 3);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,0);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value = 0x3039;
  local_f0.ptr = (byte *)(local_58.pointers + 3);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,1);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value = 0x1a85;
  local_f0.ptr = (byte *)(local_58.pointers + 4);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,0);
  ((WireValue<uint32_t>_conflict *)local_f0.ptr)->value = 0x75bcd15;
  local_f0.ptr = (byte *)(local_58.pointers + 4);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,1);
  ((WireValue<uint32_t>_conflict *)local_f0.ptr)->value = 0xdfb38d2;
  local_f0.ptr = (byte *)(local_58.pointers + 5);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,0);
  *(WirePointer *)local_f0.ptr = (WirePointer)0x462d53c8abac0;
  local_f0.ptr = (byte *)(local_58.pointers + 5);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x1,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,1);
  *(WirePointer *)local_f0.ptr = (WirePointer)0x85561edaa4b87;
  local_f0.ptr = (byte *)(local_58.pointers + 6);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x10000,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,0);
  local_98._0_8_ = local_f0.segment;
  local_98._8_8_ = local_f0.capTable;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_98,value);
  local_f0.ptr = (byte *)(local_58.pointers + 6);
  local_f0.segment = local_58.segment;
  local_f0.capTable = local_58.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f0,(StructSize)0x10000,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_f0,(ListBuilder *)local_c8,1);
  local_98._0_8_ = local_f0.segment;
  local_98._8_8_ = local_f0.capTable;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_98,value_00);
  local_c8._16_8_ = local_58.pointers + 7;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initList(&local_f0,(PointerBuilder *)local_c8,POINTER,3);
  local_c8._0_8_ = (SegmentBuilder *)0x200000001;
  local_c8._8_4_ = 3;
  value_01._M_len = 3;
  value_01._M_array = (iterator)local_c8;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_f0,0,value_01);
  local_c8._0_8_ = (SegmentBuilder *)0x500000004;
  value_02._M_len = 2;
  value_02._M_array = (iterator)local_c8;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_f0,1,value_02);
  local_c8._0_4_ = 0xbc4ff2;
  value_03._M_len = 1;
  value_03._M_array = (iterator)local_c8;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_f0,2,value_03);
  local_c8._16_8_ = local_58.pointers + 8;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initList(&local_f0,(PointerBuilder *)local_c8,POINTER,3);
  local_c8._0_8_ = "foo";
  local_c8._8_8_ = &DAT_00000004;
  local_c8._16_8_ = "bar";
  uStack_b0._0_4_ = 4;
  uStack_b0._4_4_ = 0;
  value_04._M_len = 2;
  value_04._M_array = (iterator)local_c8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_f0,0,value_04);
  local_c8._0_8_ = "baz";
  local_c8._8_8_ = &DAT_00000004;
  value_05._M_len = 1;
  value_05._M_array = (iterator)local_c8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_f0,1,value_05);
  local_c8._0_8_ = "qux";
  local_c8._8_8_ = &DAT_00000004;
  local_c8._16_8_ = "corge";
  uStack_b0._0_4_ = 6;
  uStack_b0._4_4_ = 0;
  value_06._M_len = 2;
  value_06._M_array = (iterator)local_c8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_f0,2,value_06);
  local_c8._16_8_ = local_58.pointers + 9;
  local_c8._0_8_ = local_58.segment;
  local_c8._8_8_ = local_58.capTable;
  PointerBuilder::initList(&local_f0,(PointerBuilder *)local_c8,POINTER,2);
  local_98._0_8_ = local_f0.segment;
  local_98._8_8_ = local_f0.capTable;
  local_98._16_8_ = local_f0.ptr;
  PointerBuilder::initStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)local_98,2,(StructSize)0x140006);
  ListBuilder::getStructElement((StructBuilder *)local_98,(ListBuilder *)local_c8,0);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_98._16_8_ + 4))->upper32Bits = 0x7b;
  ListBuilder::getStructElement((StructBuilder *)local_98,(ListBuilder *)local_c8,1);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_98._16_8_ + 4))->upper32Bits = 0x1c8;
  local_70.pointer =
       (WirePointer *)
       ((long)&((WireValue<uint32_t>_conflict *)local_f0.ptr)->value + (ulong)(local_f0.step >> 3));
  local_70.segment = local_f0.segment;
  local_70.capTable = local_f0.capTable;
  PointerBuilder::initStructList((ListBuilder *)local_98,&local_70,1,(StructSize)0x140006);
  local_c8._0_8_ = local_98._0_8_;
  local_c8._8_8_ = local_98._8_8_;
  local_c8._16_8_ = local_98._16_8_;
  uStack_b0 = (WirePointer *)local_98._24_8_;
  local_a8 = local_98._32_4_;
  SStack_a4 = local_98._36_2_;
  EStack_a2 = local_98[0x26];
  uStack_a1 = local_98[0x27];
  ListBuilder::getStructElement((StructBuilder *)local_98,(ListBuilder *)local_c8,0);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_98._16_8_ + 4))->upper32Bits = 0x315;
  return;
}

Assistant:

void initTestMessage(TestListDefaults::Builder builder) { genericInitListDefaults(builder); }